

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

void __thiscall
llbuild::core::TaskInterface::complete(TaskInterface *this,ValueType *value,bool forceChange)

{
  pointer *pppTVar1;
  BuildEngineImpl *this_00;
  RuleInfo *pRVar2;
  pointer __s1;
  pointer puVar3;
  pointer ppTVar4;
  BuildEngineDelegate *pBVar5;
  pointer __src;
  int iVar6;
  TaskInfo *pTVar7;
  ulong uVar8;
  pointer __dest;
  size_t sVar9;
  ulong uVar10;
  ValueType *__s2;
  allocator_type *__a;
  Twine local_48;
  
  this_00 = (BuildEngineImpl *)this->impl;
  pTVar7 = anon_unknown.dwarf_2a7c26::BuildEngineImpl::getTaskInfo(this_00,(Task *)this->ctx);
  if (pTVar7 == (TaskInfo *)0x0) {
    __assert_fail("taskInfo && \"cannot request inputs for an unknown task\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x70a,
                  "void (anonymous namespace)::BuildEngineImpl::taskIsComplete(Task *, ValueType &&, bool)"
                 );
  }
  pRVar2 = pTVar7->forRuleInfo;
  if (pRVar2->state != InProgressComputing) {
    pBVar5 = this_00->delegate;
    llvm::Twine::Twine(&local_48,"invalid state for marking task complete");
    (*pBVar5->_vptr_BuildEngineDelegate[7])(pBVar5,&local_48);
    LOCK();
    (this_00->buildCancelled)._M_base._M_i = true;
    UNLOCK();
    return;
  }
  if (pTVar7 != (TaskInfo *)(pRVar2->inProgressInfo).pendingScanRecord) {
    __assert_fail("taskInfo == ruleInfo->getPendingTaskInfo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x713,
                  "void (anonymous namespace)::BuildEngineImpl::taskIsComplete(Task *, ValueType &&, bool)"
                 );
  }
  (pRVar2->result).signature.value =
       (((pRVar2->rule)._M_t.
         super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>._M_t.
         super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
         super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl)->signature).value;
  if (!forceChange) {
    __s1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
    puVar3 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    sVar9 = (long)puVar3 - (long)__s1;
    __s2 = (ValueType *)
           (pRVar2->result).value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    if (sVar9 == (long)(pRVar2->result).value.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)__s2) {
      if (puVar3 == __s1) goto LAB_0015d779;
      iVar6 = bcmp(__s1,__s2,sVar9);
      if (iVar6 == 0) goto LAB_0015d779;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(pRVar2->result).value);
  (pRVar2->result).computedAt = this_00->currentEpoch;
  __s2 = value;
LAB_0015d779:
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this_00->finishedTaskInfosMutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  ppTVar4 = (this_00->finishedTaskInfos).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar4 ==
      (this_00->finishedTaskInfos).
      super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __src = (this_00->finishedTaskInfos).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    sVar9 = (long)ppTVar4 - (long)__src;
    if (sVar9 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (long)sVar9 >> 3;
    uVar8 = 1;
    if (ppTVar4 != __src) {
      uVar8 = uVar10;
    }
    __a = (allocator_type *)(uVar8 + uVar10);
    if ((allocator_type *)0xffffffffffffffe < __a) {
      __a = (allocator_type *)0xfffffffffffffff;
    }
    if (CARRY8(uVar8,uVar10)) {
      __a = (allocator_type *)0xfffffffffffffff;
    }
    if (__a == (allocator_type *)0x0) {
      __dest = (pointer)0x0;
    }
    else {
      __dest = std::
               allocator_traits<std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
               ::allocate(__a,(size_type)__s2);
    }
    __dest[uVar10] = pTVar7;
    if (0 < (long)sVar9) {
      memmove(__dest,__src,sVar9);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)(this_00->finishedTaskInfos).
                                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
    }
    (this_00->finishedTaskInfos).
    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = __dest;
    (this_00->finishedTaskInfos).
    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + sVar9 + 8);
    (this_00->finishedTaskInfos).
    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + (long)__a;
  }
  else {
    *ppTVar4 = pTVar7;
    pppTVar1 = &(this_00->finishedTaskInfos).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->finishedTaskInfosMutex);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void TaskInterface::complete(ValueType &&value, bool forceChange) {
  Task* task = static_cast<Task*>(ctx);
  static_cast<BuildEngineImpl*>(impl)->taskIsComplete(task, std::move(value),
                                                      forceChange);
}